

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_things.cpp
# Opt level: O2

void swrenderer::R_DrawSprite(vissprite_t *spr)

{
  float fVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  vertex_t vVar4;
  short sVar5;
  short sVar6;
  ushort uVar7;
  lighttable_t *plVar8;
  lightlist_t *plVar9;
  F3DFloor *pFVar10;
  secplane_t *psVar11;
  sector_t *psVar12;
  vertex_t *pvVar13;
  long lVar14;
  double dVar15;
  double dVar16;
  long lVar17;
  drawseg_t *pdVar18;
  undefined2 uVar19;
  byte bVar20;
  anon_union_4_2_12391d7c_for_PalEntry_0 fade;
  int iVar21;
  uint uVar22;
  extsector_t *peVar23;
  FDynamicColormap *pFVar24;
  short sVar25;
  short sVar26;
  int iVar27;
  SWORD *b2;
  FDynamicColormap **ppFVar28;
  ulong uVar29;
  BYTE *pBVar30;
  int iVar31;
  short sVar32;
  long lVar33;
  uint uVar34;
  uint uVar35;
  anon_struct_4_4_d8359877_for_anon_union_4_2_12391d7c_for_PalEntry_0_0 color;
  sector_t_conflict *psVar36;
  long lVar37;
  long lVar38;
  drawseg_t *ds;
  double dVar40;
  double dVar41;
  float fVar42;
  float fVar43;
  double dVar44;
  DVector2 local_48;
  drawseg_t *pdVar39;
  
  plVar8 = (spr->Style).colormap;
  if (((spr->field_0x90 & 1) == 0) && ((spr->field_13).pic == (FTexture *)0x0)) {
    if (((fake3D & 1) != 0) && ((double)(spr->gpos).Z <= sclipBottom)) {
      return;
    }
    if (((fake3D & 2) != 0) && (sclipTop <= (double)(spr->gpos).Z)) {
      return;
    }
    R_DrawParticle(spr);
    return;
  }
  sVar5 = spr->x1;
  lVar38 = (long)sVar5;
  sVar6 = spr->x2;
  if (sVar6 <= sVar5) {
    return;
  }
  psVar36 = spr->sector;
  if (psVar36 == (sector_t_conflict *)0x0) {
    return;
  }
  if (((fake3D & 1) != 0) && ((double)(spr->field_3).field_0.gzt <= sclipBottom)) {
    return;
  }
  if (((fake3D & 2) != 0) && (sclipTop <= (double)(spr->field_3).field_0.gzb)) {
    return;
  }
  if ((((fixedcolormap == 0) && (fixedlightlev < 0)) &&
      (peVar23 = psVar36->e, peVar23 != (extsector_t *)0x0)) &&
     (uVar22 = (peVar23->XFloor).lightlist.Count, uVar22 != 0)) {
    if ((fake3D & 2) == 0) {
      local_48.X = ViewPos.X;
      local_48.Y = ViewPos.Y;
      sclipTop = secplane_t::ZatPoint(&psVar36->ceilingplane,&local_48);
      peVar23 = spr->sector->e;
      uVar22 = (peVar23->XFloor).lightlist.Count;
    }
    do {
      uVar22 = uVar22 - 1;
      if ((int)uVar22 < 0) goto LAB_003153d6;
      uVar34 = uVar22 & 0x7fffffff;
      plVar9 = (peVar23->XFloor).lightlist.Array;
    } while (plVar9[uVar34].plane.D * plVar9[uVar34].plane.negiC < sclipTop);
    pFVar10 = plVar9[uVar34].caster;
    if ((pFVar10 != (F3DFloor *)0x0) &&
       (((pFVar10->flags >> 0x10 & 1) == 0 ||
        (psVar11 = (pFVar10->bottom).plane, psVar11->D * psVar11->negiC < sclipTop)))) {
      psVar12 = pFVar10->model;
      if ((pFVar10->flags >> 0x1b & 1) == 0) {
        if (psVar12 == (sector_t *)0x0) goto LAB_003153d6;
        ppFVar28 = &plVar9[uVar34].extra_colormap;
      }
      else {
        ppFVar28 = &psVar12->ColorMap;
      }
      pFVar24 = *ppFVar28;
      bVar20 = (spr->Style).RenderStyle.field_0.Flags;
      uVar34 = bVar20 & 0x20;
      uVar22 = uVar34 >> 5 ^ 1;
      if ((bVar20 & 0x10) == 0) {
        uVar22 = uVar34;
      }
      uVar34 = (spr->Style).RenderStyle.AsDWORD;
      uVar35 = uVar34 >> 0x18;
      if ((uVar34 == LegacyRenderStyles[7].AsDWORD) && ((pFVar24->Fade).field_0.d != 0)) {
        pFVar24 = GetSpecialLights((PalEntry)(pFVar24->Color).field_0.field_0,(PalEntry)0x0,
                                   pFVar24->Desaturate);
        uVar35 = (uint)(spr->Style).RenderStyle.field_0.Flags;
      }
      if ((uVar35 & 0x40) == 0) {
        if (uVar22 != 0) {
          color = (pFVar24->Color).field_0.field_0;
          fade.field_0 = (anon_struct_4_4_d8359877_for_anon_union_4_2_12391d7c_for_PalEntry_0_0)
                         PalEntry::InverseColor(&pFVar24->Fade);
          iVar21 = pFVar24->Desaturate;
          goto LAB_0031532f;
        }
      }
      else {
        color = (pFVar24->Color).field_0.field_0;
        iVar21 = pFVar24->Desaturate;
        if (uVar22 == 0) {
          fade.d = 0;
        }
        else {
          fade.d = 0xffffff;
        }
LAB_0031532f:
        pFVar24 = GetSpecialLights((PalEntry)color,(PalEntry)fade.field_0,iVar21);
      }
      uVar29 = (ulong)fixedlightlev;
      if ((long)uVar29 < 0) {
        if ((foggy != '\0') || ((spr->renderflags & 0x10) == 0)) {
          spriteshade = (psVar12->lightlevel + r_actualextralight) * -0x4000 + 0x3d0000;
          dVar40 = (double)spr->depth;
          if (dVar40 <= 0.0078125) {
            dVar40 = 0.0078125;
          }
          dVar40 = r_SpriteVisibility / dVar40;
          if (24.0 <= dVar40) {
            dVar40 = 24.0;
          }
          iVar27 = spriteshade - SUB84(dVar40 + 103079215104.0,0) >> 0x10;
          iVar21 = 0x1f;
          if (iVar27 < 0x1f) {
            iVar21 = iVar27;
          }
          iVar27 = 0;
          if (0 < iVar21) {
            iVar27 = iVar21;
          }
          uVar29 = (ulong)(uint)(iVar27 << 8);
          goto LAB_003153cc;
        }
        if (r_fullbrightignoresectorcolor.Value != false) {
          pFVar24 = &FullNormalLight;
        }
        pBVar30 = pFVar24->Maps;
      }
      else {
LAB_003153cc:
        pBVar30 = pFVar24->Maps + uVar29;
      }
      (spr->Style).colormap = pBVar30;
    }
  }
LAB_003153d6:
  iVar21 = viewheight;
  bVar20 = spr->field_0x90;
  dVar40 = 2.2250738585072014e-308;
  if (((bVar20 & 1) != 0) && (spr->floorclip != 0.0)) {
    dVar40 = (double)(spr->field_3).field_0.gzb;
  }
  dVar44 = (double)spr->idepth * InvZtoScale;
  psVar36 = spr->heightsec;
  sVar32 = (short)viewheight;
  if ((psVar36 == (sector_t_conflict *)0x0) || (uVar7 = psVar36->MoreFlags, (uVar7 & 0x10) != 0)) {
    dVar41 = 1.79769313486232e+308;
    if (((bVar20 & 1) != 0) || (spr->floorclip == 0.0)) goto LAB_00315644;
    dVar15 = CenterY + 6755399441055744.0 +
             (double)spr->yscale *
             ((double)((spr->field_13).pic)->Height -
             (spr->floorclip + (spr->field_14).field_0.texturemid));
    iVar27 = SUB84(dVar15,0);
    sVar25 = 0;
    if ((iVar27 < sVar32) && (iVar21 = iVar27, sVar25 = 0, SUB82(dVar15,0) < 1)) {
      iVar21 = 0;
    }
  }
  else {
    if (spr->FakeFlatStat != '\x02') {
      local_48.X = *(double *)&spr->gpos;
      dVar41 = secplane_t::ZatPoint(&psVar36->floorplane,(FVector2 *)&local_48);
      dVar15 = CenterY + 6755399441055744.0 + (ViewPos.Z - dVar41) * dVar44;
      sVar26 = SUB82(dVar15,0);
      bVar20 = spr->field_0x90;
      iVar27 = SUB84(dVar15,0);
      if (spr->FakeFlatStat == '\x01') {
        if (iVar27 < 1 || (bVar20 & 1) != 0) goto LAB_00315644;
        sVar25 = (short)viewheight;
        if (iVar27 < viewheight) {
          sVar25 = sVar26;
        }
        goto LAB_00315646;
      }
      if ((((bVar20 & 1) == 0) && (iVar27 < sVar32)) && (iVar21 = 0, 0 < sVar26)) {
        iVar21 = iVar27;
      }
      if (dVar40 <= dVar41) {
        dVar40 = dVar41;
      }
      psVar36 = spr->heightsec;
      uVar7 = psVar36->MoreFlags;
    }
    dVar41 = 1.79769313486232e+308;
    if ((uVar7 & 2) == 0) {
      local_48.X = *(double *)&spr->gpos;
      dVar41 = secplane_t::ZatPoint(&psVar36->ceilingplane,(FVector2 *)&local_48);
      dVar15 = CenterY + 6755399441055744.0 + (ViewPos.Z - dVar41) * dVar44;
      sVar32 = SUB82(dVar15,0);
      iVar27 = SUB84(dVar15,0);
      bVar20 = spr->field_0x90;
      if (spr->FakeFlatStat == '\x02') {
        iVar31 = (int)(short)iVar21;
        iVar21 = iVar27;
        if (sVar32 < 1) {
          iVar21 = 0;
        }
        if (iVar31 <= iVar27) {
          iVar21 = iVar31;
        }
        if ((bVar20 & 1) != 0) {
          iVar21 = iVar31;
        }
        if (dVar40 <= dVar41) {
          dVar40 = dVar41;
        }
        dVar41 = 1.79769313486232e+308;
        sVar25 = 0;
      }
      else {
        sVar25 = (short)viewheight;
        if (iVar27 < viewheight) {
          sVar25 = sVar32;
        }
        if ((bVar20 & 1) != 0) {
          sVar25 = 0;
        }
        if (iVar27 < 1) {
          sVar25 = 0;
        }
      }
    }
    else {
LAB_00315644:
      sVar25 = 0;
    }
  }
LAB_00315646:
  sVar32 = (short)iVar21;
  if ((fake3D & 1) != 0) {
    if ((bVar20 & 1) == 0) {
      pFVar10 = spr->fakefloor;
      dVar15 = sclipBottom;
      if (((pFVar10 != (F3DFloor *)0x0) &&
          (psVar11 = (pFVar10->top).plane, dVar16 = psVar11->D * psVar11->negiC, dVar16 < ViewPos.Z)
          ) && (dVar16 == sclipBottom)) {
        psVar11 = (pFVar10->bottom).plane;
        dVar15 = psVar11->D * psVar11->negiC;
      }
      dVar15 = CenterY + 6755399441055744.0 + (ViewPos.Z - dVar15) * dVar44;
      iVar27 = SUB84(dVar15,0);
      if ((iVar27 < sVar32) && (iVar21 = 0, 0 < SUB82(dVar15,0))) {
        iVar21 = iVar27;
      }
    }
    sVar32 = (short)iVar21;
    if (dVar40 <= sclipBottom) {
      dVar40 = sclipBottom;
    }
  }
  if ((fake3D & 2) != 0) {
    if ((bVar20 & 1) == 0) {
      pFVar10 = spr->fakeceiling;
      dVar15 = sclipTop;
      if (((pFVar10 != (F3DFloor *)0x0) &&
          (psVar11 = (pFVar10->bottom).plane, dVar16 = psVar11->D * psVar11->negiC,
          ViewPos.Z < dVar16)) && (dVar16 == sclipTop)) {
        psVar11 = (pFVar10->top).plane;
        dVar15 = psVar11->D * psVar11->negiC;
      }
      dVar44 = CenterY + 6755399441055744.0 + (ViewPos.Z - dVar15) * dVar44;
      iVar21 = SUB84(dVar44,0);
      if ((sVar25 < iVar21) && (sVar25 = (short)viewheight, iVar21 < viewheight)) {
        sVar25 = SUB82(dVar44,0);
      }
    }
    if (sclipTop <= dVar41) {
      dVar41 = sclipTop;
    }
  }
  if (sVar25 < sVar32) {
    iVar21 = (int)sVar6;
    uVar22 = (uint)sVar5;
    lVar37 = 0;
    do {
      R_DrawSprite::clipbot[lVar38 + lVar37] = sVar32;
      R_DrawSprite::cliptop[lVar38 + lVar37] = sVar25;
      lVar37 = lVar37 + 1;
      ds = ds_p;
      iVar27 = CurrentPortalUniq;
      lVar17 = openings;
      pdVar18 = firstdrawseg;
    } while ((int)sVar6 - uVar22 != (int)lVar37);
LAB_003157da:
    pdVar39 = ds;
    ds = pdVar39 + -1;
    if (pdVar18 < pdVar39) {
      if (pdVar39[-1].fake == 0) {
        sVar32 = pdVar39[-1].x1;
        if (((sVar32 < sVar6) && (sVar25 = pdVar39[-1].x2, sVar5 < sVar25)) &&
           ((bVar20 = pdVar39[-1].silhouette, (bVar20 & 3) != 0 ||
            ((pdVar39[-1].maskedtexturecol != -1 || (pdVar39[-1].bFogBoundary != '\0')))))) {
          uVar34 = (int)sVar32;
          if (sVar32 <= sVar5) {
            uVar34 = uVar22;
          }
          sVar26 = sVar6;
          if (sVar25 < sVar6) {
            sVar26 = sVar25;
          }
          iVar31 = (int)sVar26;
          if ((spr->field_0x90 & 2) == 0) {
            fVar1 = pdVar39[-1].sz1;
            fVar42 = pdVar39[-1].sz2;
            fVar43 = fVar1;
            if (fVar42 <= fVar1) {
              fVar43 = fVar42;
            }
            if (spr->depth < fVar43) goto LAB_0031595e;
            if (fVar42 <= fVar1) {
              fVar42 = fVar1;
            }
            if (spr->depth < fVar42) goto LAB_00315870;
          }
          else {
LAB_00315870:
            pvVar13 = ds->curline->v2;
            vVar4.p = ds->curline->v1->p;
            uVar2 = (spr->gpos).X;
            uVar3 = (spr->gpos).Y;
            dVar44 = vVar4.p.X;
            dVar15 = vVar4.p.Y;
            if (((pvVar13->p).X - dVar44) * ((double)(float)uVar3 - dVar15) <=
                ((pvVar13->p).Y - dVar15) * ((double)(float)uVar2 - dVar44)) {
LAB_0031595e:
              if ((pdVar39[-1].CurrentPortalUniq == iVar27) &&
                 ((pdVar39[-1].maskedtexturecol != -1 || (pdVar39[-1].bFogBoundary != '\0')))) {
                R_RenderMaskedSegRange(ds,uVar34,iVar31);
                iVar27 = CurrentPortalUniq;
                lVar17 = openings;
                pdVar18 = firstdrawseg;
              }
              goto LAB_003157da;
            }
          }
          lVar37 = (long)(int)uVar34;
          if ((bVar20 & 1) != 0) {
            lVar14 = pdVar39[-1].sprbottomclip;
            lVar33 = 0;
            do {
              sVar25 = *(short *)(lVar17 + lVar14 * 2 + lVar37 * 2 + (long)sVar32 * -2 + lVar33 * 2)
              ;
              if (sVar25 < R_DrawSprite::clipbot[lVar37 + lVar33]) {
                R_DrawSprite::clipbot[lVar37 + lVar33] = sVar25;
              }
              lVar33 = lVar33 + 1;
            } while (iVar31 - uVar34 != (int)lVar33);
          }
          if ((bVar20 & 2) != 0) {
            lVar14 = pdVar39[-1].sprtopclip;
            sVar32 = pdVar39[-1].x1;
            lVar33 = 0;
            do {
              sVar25 = *(short *)(lVar14 * 2 + lVar17 + lVar37 * 2 + (long)sVar32 * -2 + lVar33 * 2)
              ;
              if (R_DrawSprite::cliptop[lVar37 + lVar33] < sVar25) {
                R_DrawSprite::cliptop[lVar37 + lVar33] = sVar25;
              }
              lVar33 = lVar33 + 1;
            } while (iVar31 - uVar34 != (int)lVar33);
          }
        }
      }
      goto LAB_003157da;
    }
    if ((spr->field_0x90 & 1) == 0) {
      mfloorclip = R_DrawSprite::clipbot;
      mceilingclip = R_DrawSprite::cliptop;
      if ((spr->field_0x90 & 2) == 0) {
        R_DrawVisSprite(spr);
      }
      else {
        R_DrawWallSprite(spr);
      }
    }
    else {
      if (R_DrawSprite::clipbot[sVar6] <= R_DrawSprite::cliptop[sVar6]) {
        lVar37 = lVar38 * 2;
        for (; lVar38 < iVar21; lVar38 = lVar38 + 1) {
          if (*(short *)((long)R_DrawSprite::cliptop + lVar37) <
              *(short *)((long)R_DrawSprite::clipbot + lVar37)) {
            if ((int)sVar6 != (int)lVar38) goto LAB_00315a19;
            break;
          }
          lVar37 = lVar37 + 2;
        }
        goto LAB_00315b15;
      }
LAB_00315a19:
      if (0 < sVar5) {
        uVar19 = (short)viewheight;
        for (lVar38 = 0; (ulong)uVar22 * 2 != lVar38; lVar38 = lVar38 + 2) {
          *(undefined2 *)((long)R_DrawSprite::cliptop + lVar38) = uVar19;
        }
      }
      if (iVar21 < viewwidth + -1) {
        uVar22 = viewwidth - iVar21;
        sVar5 = (short)viewheight;
        for (uVar29 = 0; uVar22 != uVar29; uVar29 = uVar29 + 1) {
          R_DrawSprite::cliptop[(long)sVar6 + uVar29] = sVar5;
        }
      }
      dVar44 = (double)(spr->field_3).field_0.gzt;
      iVar21 = 0;
      if (dVar41 < dVar44) {
        iVar21 = SUB84((dVar44 - dVar41) / (double)spr->yscale + 6755399441055744.0,0);
      }
      iVar27 = 0x7fffffff;
      if ((double)(spr->field_3).field_0.gzb <= dVar40) {
        iVar27 = SUB84((dVar44 - dVar40) / (double)spr->yscale + 6755399441055744.0,0);
      }
      R_DrawVisVoxel(spr,iVar21,iVar27,R_DrawSprite::cliptop,R_DrawSprite::clipbot);
    }
    (spr->Style).colormap = plVar8;
  }
  else {
LAB_00315b15:
    (spr->Style).colormap = plVar8;
  }
  return;
}

Assistant:

void R_DrawSprite (vissprite_t *spr)
{
	static short clipbot[MAXWIDTH];
	static short cliptop[MAXWIDTH];
	drawseg_t *ds;
	int i;
	int x1, x2;
	int r1, r2;
	short topclip, botclip;
	short *clip1, *clip2;
	lighttable_t *colormap = spr->Style.colormap;
	F3DFloor *rover;
	FDynamicColormap *mybasecolormap;

	// [RH] Check for particles
	if (!spr->bIsVoxel && spr->pic == NULL)
	{
		// kg3D - reject invisible parts
		if ((fake3D & FAKE3D_CLIPBOTTOM) && spr->gpos.Z <= sclipBottom) return;
		if ((fake3D & FAKE3D_CLIPTOP)    && spr->gpos.Z >= sclipTop) return;
		R_DrawParticle (spr);
		return;
	}

	x1 = spr->x1;
	x2 = spr->x2;

	// [RH] Quickly reject sprites with bad x ranges.
	if (x1 >= x2)
		return;

	// [RH] Sprites split behind a one-sided line can also be discarded.
	if (spr->sector == NULL)
		return;

	// kg3D - reject invisible parts
	if ((fake3D & FAKE3D_CLIPBOTTOM) && spr->gzt <= sclipBottom) return;
	if ((fake3D & FAKE3D_CLIPTOP)    && spr->gzb >= sclipTop) return;

	// kg3D - correct colors now
	if (!fixedcolormap && fixedlightlev < 0 && spr->sector->e && spr->sector->e->XFloor.lightlist.Size()) 
	{
		if (!(fake3D & FAKE3D_CLIPTOP))
		{
			sclipTop = spr->sector->ceilingplane.ZatPoint(ViewPos);
		}
		sector_t *sec = NULL;
		for (i = spr->sector->e->XFloor.lightlist.Size() - 1; i >= 0; i--)
		{
			if (sclipTop <= spr->sector->e->XFloor.lightlist[i].plane.Zat0()) 
			{
				rover = spr->sector->e->XFloor.lightlist[i].caster;
				if (rover) 
				{
					if (rover->flags & FF_DOUBLESHADOW && sclipTop <= rover->bottom.plane->Zat0())
					{
						break;
					}
					sec = rover->model;
					if (rover->flags & FF_FADEWALLS)
					{
						mybasecolormap = sec->ColorMap;
					}
					else
					{
						mybasecolormap = spr->sector->e->XFloor.lightlist[i].extra_colormap;
					}
				}
				break;
			}
		}
		// found new values, recalculate
		if (sec) 
		{
			INTBOOL invertcolormap = (spr->Style.RenderStyle.Flags & STYLEF_InvertOverlay);

			if (spr->Style.RenderStyle.Flags & STYLEF_InvertSource)
			{
				invertcolormap = !invertcolormap;
			}

			// Sprites that are added to the scene must fade to black.
			if (spr->Style.RenderStyle == LegacyRenderStyles[STYLE_Add] && mybasecolormap->Fade != 0)
			{
				mybasecolormap = GetSpecialLights(mybasecolormap->Color, 0, mybasecolormap->Desaturate);
			}

			if (spr->Style.RenderStyle.Flags & STYLEF_FadeToBlack)
			{
				if (invertcolormap)
				{ // Fade to white
					mybasecolormap = GetSpecialLights(mybasecolormap->Color, MAKERGB(255,255,255), mybasecolormap->Desaturate);
					invertcolormap = false;
				}
				else
				{ // Fade to black
					mybasecolormap = GetSpecialLights(mybasecolormap->Color, MAKERGB(0,0,0), mybasecolormap->Desaturate);
				}
			}

			// get light level
			if (invertcolormap)
			{
				mybasecolormap = GetSpecialLights(mybasecolormap->Color, mybasecolormap->Fade.InverseColor(), mybasecolormap->Desaturate);
			}
			if (fixedlightlev >= 0)
			{
				spr->Style.colormap = mybasecolormap->Maps + fixedlightlev;
			}
			else if (!foggy && (spr->renderflags & RF_FULLBRIGHT))
			{ // full bright
				spr->Style.colormap = (r_fullbrightignoresectorcolor) ? FullNormalLight.Maps : mybasecolormap->Maps;
			}
			else
			{ // diminished light
				spriteshade = LIGHT2SHADE(sec->lightlevel + r_actualextralight);
				spr->Style.colormap = mybasecolormap->Maps + (GETPALOOKUP(
					r_SpriteVisibility / MAX(MINZ, (double)spr->depth), spriteshade) << COLORMAPSHIFT);
			}
		}
	}

	// [RH] Initialize the clipping arrays to their largest possible range
	// instead of using a special "not clipped" value. This eliminates
	// visual anomalies when looking down and should be faster, too.
	topclip = 0;
	botclip = viewheight;

	// killough 3/27/98:
	// Clip the sprite against deep water and/or fake ceilings.
	// [RH] rewrote this to be based on which part of the sector is really visible

	double scale = InvZtoScale * spr->idepth;
	double hzb = DBL_MIN, hzt = DBL_MAX;

	if (spr->bIsVoxel && spr->floorclip != 0)
	{
		hzb = spr->gzb;
	}

	if (spr->heightsec && !(spr->heightsec->MoreFlags & SECF_IGNOREHEIGHTSEC))
	{ // only things in specially marked sectors
		if (spr->FakeFlatStat != FAKED_AboveCeiling)
		{
			double hz = spr->heightsec->floorplane.ZatPoint(spr->gpos);
			int h = xs_RoundToInt(CenterY - (hz - ViewPos.Z) * scale);

			if (spr->FakeFlatStat == FAKED_BelowFloor)
			{ // seen below floor: clip top
				if (!spr->bIsVoxel && h > topclip)
				{
					topclip = short(MIN(h, viewheight));
				}
				hzt = MIN(hzt, hz);
			}
			else
			{ // seen in the middle: clip bottom
				if (!spr->bIsVoxel && h < botclip)
				{
					botclip = MAX<short> (0, h);
				}
				hzb = MAX(hzb, hz);
			}
		}
		if (spr->FakeFlatStat != FAKED_BelowFloor && !(spr->heightsec->MoreFlags & SECF_FAKEFLOORONLY))
		{
			double hz = spr->heightsec->ceilingplane.ZatPoint(spr->gpos);
			int h = xs_RoundToInt(CenterY - (hz - ViewPos.Z) * scale);

			if (spr->FakeFlatStat == FAKED_AboveCeiling)
			{ // seen above ceiling: clip bottom
				if (!spr->bIsVoxel && h < botclip)
				{
					botclip = MAX<short> (0, h);
				}
				hzb = MAX(hzb, hz);
			}
			else
			{ // seen in the middle: clip top
				if (!spr->bIsVoxel && h > topclip)
				{
					topclip = MIN(h, viewheight);
				}
				hzt = MIN(hzt, hz);
			}
		}
	}
	// killough 3/27/98: end special clipping for deep water / fake ceilings
	else if (!spr->bIsVoxel && spr->floorclip)
	{ // [RH] Move floorclip stuff from R_DrawVisSprite to here
		//int clip = ((FLOAT2FIXED(CenterY) - FixedMul (spr->texturemid - (spr->pic->GetHeight() << FRACBITS) + spr->floorclip, spr->yscale)) >> FRACBITS);
		int clip = xs_RoundToInt(CenterY - (spr->texturemid - spr->pic->GetHeight() + spr->floorclip) * spr->yscale);
		if (clip < botclip)
		{
			botclip = MAX<short>(0, clip);
		}
	}

	if (fake3D & FAKE3D_CLIPBOTTOM)
	{
		if (!spr->bIsVoxel)
		{
			double hz = sclipBottom;
			if (spr->fakefloor)
			{
				double floorz = spr->fakefloor->top.plane->Zat0();
				if (ViewPos.Z > floorz && floorz == sclipBottom )
				{
					hz = spr->fakefloor->bottom.plane->Zat0();
				}
			}
			int h = xs_RoundToInt(CenterY - (hz - ViewPos.Z) * scale);
			if (h < botclip)
			{
				botclip = MAX<short>(0, h);
			}
		}
		hzb = MAX(hzb, sclipBottom);
	}
	if (fake3D & FAKE3D_CLIPTOP)
	{
		if (!spr->bIsVoxel)
		{
			double hz = sclipTop;
			if (spr->fakeceiling != NULL)
			{
				double ceilingZ = spr->fakeceiling->bottom.plane->Zat0();
				if (ViewPos.Z < ceilingZ && ceilingZ == sclipTop)
				{
					hz = spr->fakeceiling->top.plane->Zat0();
				}
			}
			int h = xs_RoundToInt(CenterY - (hz - ViewPos.Z) * scale);
			if (h > topclip)
			{
				topclip = short(MIN(h, viewheight));
			}
		}
		hzt = MIN(hzt, sclipTop);
	}

#if 0
	// [RH] Sprites that were split by a drawseg should also be clipped
	// by the sector's floor and ceiling. (Not sure how/if to handle this
	// with fake floors, since those already do clipping.)
	if (spr->bSplitSprite &&
		(spr->heightsec == NULL || (spr->heightsec->MoreFlags & SECF_IGNOREHEIGHTSEC)))
	{
		fixed_t h = spr->sector->floorplane.ZatPoint (spr->gx, spr->gy);
		h = (centeryfrac - FixedMul (h-viewz, scale)) >> FRACBITS;
		if (h < botclip)
		{
			botclip = MAX<short> (0, h);
		}
		h = spr->sector->ceilingplane.ZatPoint (spr->gx, spr->gy);
		h = (centeryfrac - FixedMul (h-viewz, scale)) >> FRACBITS;
		if (h > topclip)
		{
			topclip = short(MIN(h, viewheight));
		}
	}
#endif

	if (topclip >= botclip)
	{
		spr->Style.colormap = colormap;
		return;
	}

	i = x2 - x1;
	clip1 = clipbot + x1;
	clip2 = cliptop + x1;
	do
	{
		*clip1++ = botclip;
		*clip2++ = topclip;
	} while (--i);

	// Scan drawsegs from end to start for obscuring segs.
	// The first drawseg that is closer than the sprite is the clip seg.

	// Modified by Lee Killough:
	// (pointer check was originally nonportable
	// and buggy, by going past LEFT end of array):

	//		for (ds=ds_p-1 ; ds >= drawsegs ; ds--)    old buggy code

	for (ds = ds_p; ds-- > firstdrawseg; )  // new -- killough
	{
		// [ZZ] portal handling here
		//if (ds->CurrentPortalUniq != spr->CurrentPortalUniq)
		//	continue;
		// [ZZ] WARNING: uncommenting the two above lines, totally breaks sprite clipping

		// kg3D - no clipping on fake segs
		if (ds->fake) continue;
		// determine if the drawseg obscures the sprite
		if (ds->x1 >= x2 || ds->x2 <= x1 ||
			(!(ds->silhouette & SIL_BOTH) && ds->maskedtexturecol == -1 &&
			 !ds->bFogBoundary) )
		{
			// does not cover sprite
			continue;
		}

		r1 = MAX<int> (ds->x1, x1);
		r2 = MIN<int> (ds->x2, x2);

		float neardepth, fardepth;
		if (!spr->bWallSprite)
		{
			if (ds->sz1 < ds->sz2)
			{
				neardepth = ds->sz1, fardepth = ds->sz2;
			}
			else
			{
				neardepth = ds->sz2, fardepth = ds->sz1;
			}
		}
		// Check if sprite is in front of draw seg:
		if ((!spr->bWallSprite && neardepth > spr->depth) || ((spr->bWallSprite || fardepth > spr->depth) &&
			(spr->gpos.Y - ds->curline->v1->fY()) * (ds->curline->v2->fX() - ds->curline->v1->fX()) -
			(spr->gpos.X - ds->curline->v1->fX()) * (ds->curline->v2->fY() - ds->curline->v1->fY()) <= 0))
		{
			// seg is behind sprite, so draw the mid texture if it has one
			if (ds->CurrentPortalUniq == CurrentPortalUniq && // [ZZ] instead, portal uniq check is made here
				(ds->maskedtexturecol != -1 || ds->bFogBoundary))
				R_RenderMaskedSegRange (ds, r1, r2);
			continue;
		}

		// clip this piece of the sprite
		// killough 3/27/98: optimized and made much shorter
		// [RH] Optimized further (at least for VC++;
		// other compilers should be at least as good as before)

		if (ds->silhouette & SIL_BOTTOM) //bottom sil
		{
			clip1 = clipbot + r1;
			clip2 = openings + ds->sprbottomclip + r1 - ds->x1;
			i = r2 - r1;
			do
			{
				if (*clip1 > *clip2)
					*clip1 = *clip2;
				clip1++;
				clip2++;
			} while (--i);
		}

		if (ds->silhouette & SIL_TOP)   // top sil
		{
			clip1 = cliptop + r1;
			clip2 = openings + ds->sprtopclip + r1 - ds->x1;
			i = r2 - r1;
			do
			{
				if (*clip1 < *clip2)
					*clip1 = *clip2;
				clip1++;
				clip2++;
			} while (--i);
		}
	}

	// all clipping has been performed, so draw the sprite

	if (!spr->bIsVoxel)
	{
		mfloorclip = clipbot;
		mceilingclip = cliptop;
		if (!spr->bWallSprite)
		{
			R_DrawVisSprite(spr);
		}
		else
		{
			R_DrawWallSprite(spr);
		}
	}
	else
	{
		// If it is completely clipped away, don't bother drawing it.
		if (cliptop[x2] >= clipbot[x2])
		{
			for (i = x1; i < x2; ++i)
			{
				if (cliptop[i] < clipbot[i])
				{
					break;
				}
			}
			if (i == x2)
			{
				spr->Style.colormap = colormap;
				return;
			}
		}
		// Add everything outside the left and right edges to the clipping array
		// for R_DrawVisVoxel().
		if (x1 > 0)
		{
			fillshort(cliptop, x1, viewheight);
		}
		if (x2 < viewwidth - 1)
		{
			fillshort(cliptop + x2, viewwidth - x2, viewheight);
		}
		int minvoxely = spr->gzt <= hzt ? 0 : xs_RoundToInt((spr->gzt - hzt) / spr->yscale);
		int maxvoxely = spr->gzb > hzb ? INT_MAX : xs_RoundToInt((spr->gzt - hzb) / spr->yscale);
		R_DrawVisVoxel(spr, minvoxely, maxvoxely, cliptop, clipbot);
	}
	spr->Style.colormap = colormap;
}